

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_model_v2.c
# Opt level: O0

MPP_RET bits_model_update(RcModelV2Ctx *ctx,EncRcTaskInfo *cfg)

{
  int val;
  RK_S32 val_00;
  RK_S32 RVar1;
  RK_U32 RVar2;
  RK_S32 local_2c;
  RK_S32 water_level;
  RK_U32 madi;
  RK_S32 real_bit;
  RcCfg *usr_cfg;
  EncRcTaskInfo *cfg_local;
  RcModelV2Ctx *ctx_local;
  
  val = cfg->bit_real;
  val_00 = cfg->madi;
  if ((rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2","enter %p\n","bits_model_update",ctx);
  }
  mpp_data_update_v2(ctx->stat_rate,(uint)(val != 0));
  mpp_data_update_v2(ctx->stat_bits,val);
  RVar1 = mpp_data_sum_v2(ctx->stat_bits);
  ctx->ins_bps = RVar1 / (ctx->usr_cfg).stats_time;
  if (ctx->watl_thrd < val + ctx->stat_watl) {
    local_2c = ctx->watl_thrd - ctx->bit_per_frame;
  }
  else {
    local_2c = (val + ctx->stat_watl) - ctx->bit_per_frame;
  }
  if (local_2c < 0) {
    local_2c = 0;
  }
  ctx->stat_watl = local_2c;
  switch(cfg->frame_type) {
  case INTER_P_FRAME:
    mpp_data_update_v2(ctx->p_bit,val);
    mpp_data_update_v2(ctx->madi,val_00);
    RVar2 = mpp_data_sum_v2(ctx->p_bit);
    ctx->p_sumbits = RVar2;
    if (ctx->p_sumbits == 0) {
      ctx->p_sumbits = 1;
    }
    ctx->p_scale = 0x10;
    break;
  default:
    break;
  case INTRA_FRAME:
    mpp_data_update_v2(ctx->i_bit,val);
    RVar2 = mpp_data_sum_v2(ctx->i_bit);
    ctx->i_sumbits = RVar2;
    ctx->i_scale = (ctx->i_sumbits * 0x50) / (ctx->p_sumbits << 1);
    if ((rc_debug & 0x40) != 0) {
      _mpp_log_l(4,"rc_model_v2","i_sumbits %d p_sumbits %d i_scale %d\n","bits_model_update",
                 (ulong)ctx->i_sumbits,(ulong)ctx->p_sumbits,ctx->i_scale);
    }
    break;
  case INTER_VI_FRAME:
    mpp_data_update_v2(ctx->vi_bit,val);
    RVar2 = mpp_data_sum_v2(ctx->vi_bit);
    ctx->vi_sumbits = RVar2;
    ctx->vi_scale = (ctx->vi_sumbits * 0x50) / (ctx->p_sumbits << 1);
    RVar2 = mpp_clip(ctx->vi_scale,0x10,0x140);
    ctx->vi_scale = RVar2;
    break;
  case INTRA_RFH_FRAME:
    mpp_data_update_v2(ctx->i_refresh_bit,val);
    mpp_data_update_v2(ctx->madi,val_00);
    RVar2 = mpp_data_sum_v2(ctx->i_refresh_bit);
    ctx->i_refresh_sumbits = RVar2;
    ctx->i_refresh_scale =
         (ctx->i_refresh_sumbits * 0x50) / ((ctx->usr_cfg).refresh_len * ctx->p_sumbits);
    RVar2 = mpp_clip(ctx->i_refresh_scale,0x10,0x40);
    ctx->i_refresh_scale = RVar2;
  }
  if ((rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2","leave %p\n","bits_model_update",ctx);
  }
  return MPP_OK;
}

Assistant:

MPP_RET bits_model_update(RcModelV2Ctx *ctx, EncRcTaskInfo *cfg)
{
    RcCfg *usr_cfg = &ctx->usr_cfg;
    RK_S32 real_bit = cfg->bit_real;
    RK_U32 madi = cfg->madi;
    RK_S32 water_level = 0;

    rc_dbg_func("enter %p\n", ctx);

    mpp_data_update_v2(ctx->stat_rate, real_bit != 0);
    mpp_data_update_v2(ctx->stat_bits, real_bit);

    ctx->ins_bps = mpp_data_sum_v2(ctx->stat_bits) / usr_cfg->stats_time;
    if (real_bit + ctx->stat_watl > ctx->watl_thrd)
        water_level = ctx->watl_thrd - ctx->bit_per_frame;
    else
        water_level = real_bit + ctx->stat_watl - ctx->bit_per_frame;

    if (water_level < 0)
        water_level = 0;

    ctx->stat_watl = water_level;

    switch (cfg->frame_type) {
    case INTRA_FRAME : {
        mpp_data_update_v2(ctx->i_bit, real_bit);
        ctx->i_sumbits = mpp_data_sum_v2(ctx->i_bit);
        ctx->i_scale = 80 * ctx->i_sumbits / (2 * ctx->p_sumbits);
        rc_dbg_rc("i_sumbits %d p_sumbits %d i_scale %d\n",
                  ctx->i_sumbits, ctx->p_sumbits, ctx->i_scale);
    } break;
    case INTER_P_FRAME : {
        mpp_data_update_v2(ctx->p_bit, real_bit);
        mpp_data_update_v2(ctx->madi,  madi);
        ctx->p_sumbits = mpp_data_sum_v2(ctx->p_bit);

        /* Avoid div zero when P frame successive drop */
        if (!ctx->p_sumbits)
            ctx->p_sumbits = 1;

        ctx->p_scale = 16;
    } break;
    case INTER_VI_FRAME: {
        mpp_data_update_v2(ctx->vi_bit, real_bit);
        ctx->vi_sumbits = mpp_data_sum_v2(ctx->vi_bit);
        ctx->vi_scale = 80 * ctx->vi_sumbits / (2 * ctx->p_sumbits);
        /* NOTE: vi_scale may be set to zero. So we should limit the range */
        ctx->vi_scale = mpp_clip(ctx->vi_scale, 16, 320);
    } break;
    case INTRA_RFH_FRAME: {
        mpp_data_update_v2(ctx->i_refresh_bit, real_bit);
        mpp_data_update_v2(ctx->madi,  madi);
        ctx->i_refresh_sumbits = mpp_data_sum_v2(ctx->i_refresh_bit);
        ctx->i_refresh_scale = 80 * ctx->i_refresh_sumbits / (usr_cfg->refresh_len * ctx->p_sumbits);
        ctx->i_refresh_scale = mpp_clip(ctx->i_refresh_scale, 16, 64);
    } break;
    default : {
    } break;
    }

    rc_dbg_func("leave %p\n", ctx);
    return MPP_OK;
}